

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Builder * __thiscall
capnp::DynamicStruct::Builder::get(Builder *__return_storage_ptr__,Builder *this,Field field)

{
  byte bVar1;
  ushort uVar2;
  undefined8 uVar3;
  WirePointer *pWVar4;
  CapTableBuilder *pCVar5;
  CapTableBuilder *pCVar6;
  SegmentBuilder *pSVar7;
  StructPointerCount SVar8;
  undefined1 uVar9;
  ListElementCount LVar10;
  BitsPerElementN<23> BVar11;
  void *pvVar12;
  StructDataBitCount SVar13;
  ElementSize EVar14;
  short sVar15;
  Which WVar16;
  StructSize elementSize;
  Schema SVar17;
  StructSchema SVar18;
  ulong uVar19;
  InterfaceSchema IVar20;
  EnumSchema EVar21;
  word *pwVar22;
  byte bVar23;
  ushort uVar24;
  ByteCount defaultSize;
  ulong uVar25;
  uint64_t uVar26;
  size_t extraout_RDX;
  uint uVar27;
  uint uVar28;
  Builder *pBVar29;
  ListBuilder *__return_storage_ptr___00;
  bool bVar30;
  Type TVar31;
  ArrayPtr<const_char> AVar32;
  ArrayPtr<const_unsigned_char> AVar33;
  ArrayPtr<unsigned_char> AVar34;
  Fault f;
  Type type;
  ListSchema listType;
  DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> _kjCondition;
  Schema schema;
  StructReader local_170;
  Type local_140;
  PointerBuilder local_130;
  int local_114;
  Builder *local_110;
  Type local_108;
  undefined1 local_f8 [32];
  uint local_d8;
  Builder *local_c8;
  Builder local_c0;
  StructBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  uchar *defaultValue;
  
  local_108.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_108._0_8_;
  bVar30 = field.parent.super_Schema.raw == (Schema)(this->schema).super_Schema.raw;
  local_f8._0_8_ = field.parent.super_Schema.raw;
  local_f8._16_8_ = " == ";
  local_f8._24_4_ = 5;
  local_f8._28_4_ = 0;
  local_d8 = CONCAT31(local_d8._1_3_,bVar30);
  local_f8._8_8_ = this;
  local_110 = __return_storage_ptr__;
  if (!bVar30) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&,char_const(&)[39]>
              ((Fault *)&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x10a,FAILED,"field.getContainingStruct() == schema",
               "_kjCondition,\"`field` is not a field of this struct.\"",
               (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_f8,
               (char (*) [39])"`field` is not a field of this struct.");
    kj::_::Debug::Fault::fatal((Fault *)&local_170);
  }
  schema = field.parent.super_Schema.raw;
  verifySetInUnion(this,field);
  SVar8 = field.proto._reader.pointerCount;
  SVar13 = field.proto._reader.dataSize;
  pWVar4 = field.proto._reader.pointers;
  pvVar12 = field.proto._reader.data;
  SVar17.raw = (RawBrandedSchema *)field.proto._reader.segment;
  local_c8 = (Builder *)field.proto._reader.capTable;
  local_114 = field.proto._reader.nestingLimit;
  local_140 = StructSchema::Field::getType(&field);
  if (SVar13 < 0x50) {
    sVar15 = 0;
  }
  else {
    sVar15 = *(short *)((long)pvVar12 + 8);
  }
  if (sVar15 == 1) {
    SVar17.raw = (RawBrandedSchema *)Type::asStruct(&local_140);
    pCVar5 = (this->builder).capTable;
    pCVar6 = (CapTableBuilder *)(this->builder).data;
    pWVar4 = (this->builder).pointers;
    (local_110->field_1).textValue.content.ptr = (char *)(this->builder).segment;
    (local_110->field_1).textValue.content.size_ = (size_t)pCVar5;
    (local_110->field_1).listValue.builder.capTable = pCVar6;
    (local_110->field_1).listValue.builder.ptr = (byte *)pWVar4;
    uVar3._0_4_ = (this->builder).dataSize;
    uVar3._4_2_ = (this->builder).pointerCount;
    uVar3._6_2_ = *(undefined2 *)&(this->builder).field_0x26;
    *(undefined4 *)((long)&local_110->field_1 + 0x28) = (undefined4)uVar3;
    *(int *)((long)&local_110->field_1 + 0x2c) = (int)((ulong)uVar3 >> 0x20);
    local_110->type = STRUCT;
    goto LAB_002545de;
  }
  if (sVar15 != 0) {
switchD_00254659_default:
    kj::_::unreachable();
  }
  if (SVar8 < 4) {
    local_f8._24_4_ = 0x7fffffff;
    local_f8._8_8_ = (Builder *)0x0;
    local_f8._16_8_ = (WirePointer *)0x0;
    SVar17.raw = (RawBrandedSchema *)0x0;
  }
  else {
    local_f8._16_8_ = pWVar4 + 3;
    local_f8._8_8_ = local_c8;
    local_f8._24_4_ = local_114;
  }
  local_f8._0_8_ = SVar17.raw;
  capnp::_::PointerReader::getStruct(&local_170,(PointerReader *)local_f8,(word *)0x0);
  pBVar29 = local_110;
  WVar16 = LIST;
  if (local_140.listDepth == '\0') {
    WVar16 = local_140.baseType;
  }
  switch(WVar16) {
  case VOID:
    local_110->type = VOID;
    break;
  case BOOL:
    uVar27 = 0;
    if (0x3f < SVar13) {
      uVar27 = *(uint *)((long)pvVar12 + 4);
    }
    if (local_170.dataSize < 0x11) {
      bVar23 = 0;
    }
    else {
      bVar23 = *(byte *)((long)local_170.data + 2) & 1;
    }
    bVar1 = *(byte *)((long)(this->builder).data + (ulong)(uVar27 >> 3));
    local_110->type = BOOL;
    (local_110->field_1).boolValue = (bool)((bVar1 >> (uVar27 & 7) & 1) != 0 ^ bVar23);
    break;
  case INT8:
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_170.dataSize < 0x18) {
      bVar23 = 0;
    }
    else {
      bVar23 = *(byte *)((long)local_170.data + 2);
    }
    bVar1 = *(byte *)((long)(this->builder).data + uVar19);
    local_110->type = INT;
    SVar17.raw = (RawBrandedSchema *)(long)(char)(bVar23 ^ bVar1);
    goto LAB_002545de;
  case INT16:
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_170.dataSize < 0x20) {
      uVar24 = 0;
    }
    else {
      uVar24 = *(ushort *)((long)local_170.data + 2);
    }
    uVar2 = *(ushort *)((long)(this->builder).data + uVar19 * 2);
    local_110->type = INT;
    SVar17.raw = (RawBrandedSchema *)(long)(short)(uVar24 ^ uVar2);
    goto LAB_002545de;
  case INT32:
    uVar27 = 0;
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (0x3f < local_170.dataSize) {
      uVar27 = *(uint *)((long)local_170.data + 4);
    }
    uVar28 = *(uint *)((long)(this->builder).data + uVar19 * 4);
    local_110->type = INT;
    SVar17.raw = (RawBrandedSchema *)(long)(int)(uVar27 ^ uVar28);
    goto LAB_002545de;
  case INT64:
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_170.dataSize < 0x80) {
      uVar25 = 0;
    }
    else {
      uVar25 = *(ulong *)((long)local_170.data + 8);
    }
    uVar26 = uVar25 ^ *(ulong *)((long)(this->builder).data + uVar19 * 8);
    local_110->type = INT;
    goto LAB_00254bf6;
  case UINT8:
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_170.dataSize < 0x18) {
      bVar23 = 0;
    }
    else {
      bVar23 = *(byte *)((long)local_170.data + 2);
    }
    bVar1 = *(byte *)((long)(this->builder).data + uVar19);
    local_110->type = UINT;
    SVar17.raw = (RawBrandedSchema *)(ulong)(bVar23 ^ bVar1);
    goto LAB_002545de;
  case UINT16:
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_170.dataSize < 0x20) {
      uVar24 = 0;
    }
    else {
      uVar24 = *(ushort *)((long)local_170.data + 2);
    }
    uVar2 = *(ushort *)((long)(this->builder).data + uVar19 * 2);
    local_110->type = UINT;
    SVar17.raw = (RawBrandedSchema *)(ulong)(uVar24 ^ uVar2);
    goto LAB_002545de;
  case UINT32:
    uVar27 = 0;
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (0x3f < local_170.dataSize) {
      uVar27 = *(uint *)((long)local_170.data + 4);
    }
    SVar17.raw = (RawBrandedSchema *)
                 (ulong)(uVar27 ^ *(uint *)((long)(this->builder).data + uVar19 * 4));
    local_110->type = UINT;
LAB_002545de:
    (local_110->field_1).structValue.schema.super_Schema.raw = SVar17.raw;
    pBVar29 = local_110;
    break;
  case UINT64:
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_170.dataSize < 0x80) {
      uVar25 = 0;
    }
    else {
      uVar25 = *(ulong *)((long)local_170.data + 8);
    }
    uVar26 = uVar25 ^ *(ulong *)((long)(this->builder).data + uVar19 * 8);
    local_110->type = UINT;
    goto LAB_00254bf6;
  case FLOAT32:
    uVar27 = 0;
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (0x3f < local_170.dataSize) {
      uVar27 = *(uint *)((long)local_170.data + 4);
    }
    uVar28 = *(uint *)((long)(this->builder).data + uVar19 * 4);
    local_110->type = FLOAT;
    (local_110->field_1).floatValue = (double)(float)(uVar27 ^ uVar28);
    break;
  case FLOAT64:
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_170.dataSize < 0x80) {
      uVar25 = 0;
    }
    else {
      uVar25 = *(ulong *)((long)local_170.data + 8);
    }
    uVar26 = uVar25 ^ *(ulong *)((long)(this->builder).data + uVar19 * 8);
    local_110->type = FLOAT;
LAB_00254bf6:
    (local_110->field_1).uintValue = uVar26;
    break;
  case TEXT:
    if ((local_170.dataSize < 0x10) || (*local_170.data != 0x12)) {
      AVar32 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText((Reader *)&local_170);
      defaultSize = (int)AVar32.size_ - 1;
    }
    else {
      AVar32.size_ = extraout_RDX;
      AVar32.ptr = "";
      defaultSize = 0;
    }
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    local_f8._16_8_ = (this->builder).pointers + uVar19;
    local_f8._0_8_ = (this->builder).segment;
    local_f8._8_8_ = (this->builder).capTable;
    capnp::_::PointerBuilder::getBlob<capnp::Text>
              (&local_c0,(PointerBuilder *)local_f8,AVar32.ptr,defaultSize);
    (pBVar29->field_1).textValue.content.size_ = local_c0.content.size_;
    (pBVar29->field_1).intValue = local_c0._0_8_;
    (pBVar29->field_1).textValue.content.ptr = local_c0.content.ptr;
    pBVar29->type = TEXT;
    break;
  case DATA:
    if ((local_170.dataSize < 0x10) || (*local_170.data != 0x12)) {
      AVar33 = (ArrayPtr<const_unsigned_char>)
               capnp::schema::Value::Reader::getData((Reader *)&local_170);
      defaultValue = AVar33.ptr;
    }
    else {
      AVar33.size_ = 0;
      AVar33.ptr = (uchar *)local_170.data;
      defaultValue = (uchar *)0x0;
    }
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    local_f8._16_8_ = (this->builder).pointers + uVar19;
    local_f8._0_8_ = (this->builder).segment;
    local_f8._8_8_ = (this->builder).capTable;
    AVar34 = (ArrayPtr<unsigned_char>)
             capnp::_::PointerBuilder::getBlob<capnp::Data>
                       ((PointerBuilder *)local_f8,defaultValue,(ByteCount)AVar33.size_);
    pBVar29->type = DATA;
    (pBVar29->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar34;
    break;
  case LIST:
    TVar31 = (Type)Type::asList(&local_140);
    local_108.listDepth = TVar31.listDepth;
    local_108 = TVar31;
    if ((local_108.listDepth == '\0') && (TVar31.baseType == STRUCT)) {
      if (SVar13 < 0x40) {
        uVar19 = 0;
      }
      else {
        uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
      }
      local_130.segment = (this->builder).segment;
      local_130.capTable = (this->builder).capTable;
      local_130.pointer = (this->builder).pointers + uVar19;
      Type::asStruct(&local_108);
      elementSize = anon_unknown_71::structSizeFromSchema((StructSchema)schema.raw);
      if ((local_170.dataSize < 0x10) || (*local_170.data != 0x12)) {
        if (local_170.pointerCount == 0) {
          local_170.nestingLimit = 0x7fffffff;
          local_170.capTable = (CapTableReader *)0x0;
          local_170.pointers = (WirePointer *)0x0;
          local_170.segment = (SegmentReader *)0x0;
        }
        local_f8._0_8_ = local_170.segment;
        local_f8._8_8_ = local_170.capTable;
        local_f8._16_8_ = local_170.pointers;
        local_f8._24_4_ = local_170.nestingLimit;
        pwVar22 = capnp::_::PointerReader::getUnchecked((PointerReader *)local_f8);
      }
      else {
        pwVar22 = (word *)0x0;
      }
      __return_storage_ptr___00 = &local_58;
      capnp::_::PointerBuilder::getStructList
                (__return_storage_ptr___00,&local_130,elementSize,pwVar22);
    }
    else {
      if (SVar13 < 0x40) {
        uVar19 = 0;
      }
      else {
        uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
      }
      local_130.pointer = (this->builder).pointers + uVar19;
      local_130.segment = (this->builder).segment;
      local_130.capTable = (this->builder).capTable;
      WVar16 = LIST;
      if (local_108.listDepth == '\0') {
        WVar16 = TVar31.baseType;
      }
      EVar14 = anon_unknown_71::elementSizeFor(WVar16);
      if ((local_170.dataSize < 0x10) || (*local_170.data != 0x12)) {
        if (local_170.pointerCount == 0) {
          local_170.nestingLimit = 0x7fffffff;
          local_170.capTable = (CapTableReader *)0x0;
          local_170.pointers = (WirePointer *)0x0;
          local_170.segment = (SegmentReader *)0x0;
        }
        local_f8._0_8_ = local_170.segment;
        local_f8._8_8_ = local_170.capTable;
        local_f8._16_8_ = local_170.pointers;
        local_f8._24_4_ = local_170.nestingLimit;
        pwVar22 = capnp::_::PointerReader::getUnchecked((PointerReader *)local_f8);
      }
      else {
        pwVar22 = (word *)0x0;
      }
      __return_storage_ptr___00 = &local_80;
      capnp::_::PointerBuilder::getList(__return_storage_ptr___00,&local_130,EVar14,pwVar22);
    }
    SVar8 = __return_storage_ptr___00->structPointerCount;
    EVar14 = __return_storage_ptr___00->elementSize;
    uVar9 = __return_storage_ptr___00->field_0x27;
    *(StructDataBitCount *)((long)&pBVar29->field_1 + 0x30) =
         __return_storage_ptr___00->structDataSize;
    *(StructPointerCount *)((long)&pBVar29->field_1 + 0x34) = SVar8;
    *(ElementSize *)((long)&pBVar29->field_1 + 0x36) = EVar14;
    *(undefined1 *)((long)&pBVar29->field_1 + 0x37) = uVar9;
    pSVar7 = __return_storage_ptr___00->segment;
    pCVar5 = __return_storage_ptr___00->capTable;
    LVar10 = __return_storage_ptr___00->elementCount;
    BVar11 = __return_storage_ptr___00->step;
    (pBVar29->field_1).listValue.builder.ptr = __return_storage_ptr___00->ptr;
    *(ListElementCount *)((long)&pBVar29->field_1 + 0x28) = LVar10;
    *(BitsPerElementN<23> *)((long)&pBVar29->field_1 + 0x2c) = BVar11;
    (pBVar29->field_1).textValue.content.size_ = (size_t)pSVar7;
    (pBVar29->field_1).listValue.builder.capTable = pCVar5;
    pBVar29->type = LIST;
    (pBVar29->field_1).listValue.schema.elementType = TVar31;
    break;
  case ENUM:
    if (local_170.dataSize < 0x20) {
      uVar24 = 0;
    }
    else {
      uVar24 = *(ushort *)((long)local_170.data + 2);
    }
    EVar21 = Type::asEnum(&local_140);
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    uVar2 = *(ushort *)((long)(this->builder).data + uVar19 * 2);
    pBVar29->type = ENUM;
    (pBVar29->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar21.super_Schema.raw;
    *(ushort *)&(pBVar29->field_1).listValue.schema.elementType.field_4 = uVar24 ^ uVar2;
    break;
  case STRUCT:
    SVar18 = Type::asStruct(&local_140);
    uVar27 = 0;
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    local_130.segment = (this->builder).segment;
    local_130.capTable = (this->builder).capTable;
    local_130.pointer = (this->builder).pointers + uVar19;
    local_108._0_8_ = SVar18.super_Schema.raw;
    Schema::getProto((Reader *)local_f8,(Schema *)&local_108);
    if (0x7f < local_d8) {
      uVar27 = (uint)(((WirePointer *)(local_f8._16_8_ + 8))->field_1).structRef.ptrCount.value;
    }
    uVar28 = 0;
    if (0xcf < local_d8) {
      uVar28 = (uint)(ushort)(((WirePointer *)(local_f8._16_8_ + 0x18))->offsetAndKind).value <<
               0x10;
    }
    if ((local_170.dataSize < 0x10) || (*local_170.data != 0x12)) {
      if (local_170.pointerCount == 0) {
        local_170.nestingLimit = 0x7fffffff;
        local_170.capTable = (CapTableReader *)0x0;
        local_170.pointers = (WirePointer *)0x0;
        local_170.segment = (SegmentReader *)0x0;
      }
      local_f8._0_8_ = local_170.segment;
      local_f8._8_8_ = local_170.capTable;
      local_f8._16_8_ = local_170.pointers;
      local_f8._24_4_ = local_170.nestingLimit;
      pwVar22 = capnp::_::PointerReader::getUnchecked((PointerReader *)local_f8);
    }
    else {
      pwVar22 = (word *)0x0;
    }
    capnp::_::PointerBuilder::getStruct(&local_a8,&local_130,(StructSize)(uVar28 | uVar27),pwVar22);
    *(undefined8 *)&(pBVar29->field_1).listValue.builder.elementCount = local_a8._32_8_;
    (pBVar29->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a8.data;
    (pBVar29->field_1).listValue.builder.ptr = (byte *)local_a8.pointers;
    (pBVar29->field_1).textValue.content.ptr = (char *)local_a8.segment;
    (pBVar29->field_1).textValue.content.size_ = (size_t)local_a8.capTable;
    pBVar29->type = STRUCT;
    (pBVar29->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar18.super_Schema.raw;
    break;
  case INTERFACE:
    IVar20 = Type::asInterface(&local_140);
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    local_f8._16_8_ = (this->builder).pointers + uVar19;
    local_f8._0_8_ = (this->builder).segment;
    local_f8._8_8_ = (this->builder).capTable;
    capnp::_::PointerBuilder::getCapability(&local_130);
    pBVar29->type = CAPABILITY;
    (pBVar29->field_1).intValue = (int64_t)local_130.segment;
    (pBVar29->field_1).textValue.content.ptr = (char *)local_130.capTable;
    (pBVar29->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar20.super_Schema.raw;
    break;
  case ANY_POINTER:
    if (SVar13 < 0x40) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    pWVar4 = (this->builder).pointers;
    pSVar7 = (this->builder).segment;
    pCVar5 = (this->builder).capTable;
    local_110->type = ANY_POINTER;
    (local_110->field_1).intValue = (int64_t)pSVar7;
    (local_110->field_1).textValue.content.ptr = (char *)pCVar5;
    (local_110->field_1).textValue.content.size_ = (size_t)(pWVar4 + uVar19);
    break;
  default:
    goto switchD_00254659_default;
  }
  return pBVar29;
}

Assistant:

DynamicValue::Builder DynamicStruct::Builder::get(StructSchema::Field field) {
  KJ_REQUIRE(field.getContainingStruct() == schema, "`field` is not a field of this struct.");
  verifySetInUnion(field);

  auto proto = field.getProto();
  auto type = field.getType();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();

      // Note that the default value might be "anyPointer" even if the type is some pointer type
      // *other than* anyPointer. This happens with generics -- the field is actually a generic
      // parameter that has been bound, but the default value was of course compiled without any
      // binding available.
      auto dval = slot.getDefaultValue();

      switch (type.which()) {
        case schema::Type::VOID:
          return builder.getDataField<Void>(assumeDataOffset(slot.getOffset()));

#define HANDLE_TYPE(discrim, titleCase, type) \
        case schema::Type::discrim: \
          return builder.getDataField<type>( \
              assumeDataOffset(slot.getOffset()), \
              bitCast<_::Mask<type>>(dval.get##titleCase()));

        HANDLE_TYPE(BOOL, Bool, bool)
        HANDLE_TYPE(INT8, Int8, int8_t)
        HANDLE_TYPE(INT16, Int16, int16_t)
        HANDLE_TYPE(INT32, Int32, int32_t)
        HANDLE_TYPE(INT64, Int64, int64_t)
        HANDLE_TYPE(UINT8, Uint8, uint8_t)
        HANDLE_TYPE(UINT16, Uint16, uint16_t)
        HANDLE_TYPE(UINT32, Uint32, uint32_t)
        HANDLE_TYPE(UINT64, Uint64, uint64_t)
        HANDLE_TYPE(FLOAT32, Float32, float)
        HANDLE_TYPE(FLOAT64, Float64, double)

#undef HANDLE_TYPE

        case schema::Type::ENUM: {
          uint16_t typedDval = dval.getEnum();
          return DynamicEnum(type.asEnum(),
              builder.getDataField<uint16_t>(assumeDataOffset(slot.getOffset()), typedDval));
        }

        case schema::Type::TEXT: {
          Text::Reader typedDval = dval.isAnyPointer() ? Text::Reader() : dval.getText();
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .getBlob<Text>(typedDval.begin(),
                            assumeMax<MAX_TEXT_SIZE>(typedDval.size()) * BYTES);
        }

        case schema::Type::DATA: {
          Data::Reader typedDval = dval.isAnyPointer() ? Data::Reader() : dval.getData();
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .getBlob<Data>(typedDval.begin(),
                            assumeBits<BLOB_SIZE_BITS>(typedDval.size()) * BYTES);
        }

        case schema::Type::LIST: {
          ListSchema listType = type.asList();
          if (listType.whichElementType() == schema::Type::STRUCT) {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .getStructList(structSizeFromSchema(listType.getStructElementType()),
                                      dval.isAnyPointer() ? nullptr :
                                          dval.getList().getAs<_::UncheckedMessage>()));
          } else {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .getList(elementSizeFor(listType.whichElementType()),
                                dval.isAnyPointer() ? nullptr :
                                    dval.getList().getAs<_::UncheckedMessage>()));
          }
        }

        case schema::Type::STRUCT: {
          auto structSchema = type.asStruct();
          return DynamicStruct::Builder(structSchema,
              builder.getPointerField(assumePointerOffset(slot.getOffset()))
                     .getStruct(structSizeFromSchema(structSchema),
                                dval.isAnyPointer() ? nullptr :
                                    dval.getStruct().getAs<_::UncheckedMessage>()));
        }

        case schema::Type::ANY_POINTER:
          return AnyPointer::Builder(
              builder.getPointerField(assumePointerOffset(slot.getOffset())));

        case schema::Type::INTERFACE:
          return DynamicCapability::Client(type.asInterface(),
              builder.getPointerField(assumePointerOffset(slot.getOffset())).getCapability());
      }

      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP:
      return DynamicStruct::Builder(type.asStruct(), builder);
  }

  KJ_UNREACHABLE;
}